

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_test.cpp
# Opt level: O3

void evaluations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>>
               (rt_expr<viennamath::rt_expression_interface<double>_> *e,double ref_solution)

{
  rt_expression_interface<double> *prVar1;
  ostream *poVar2;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  numeric_type nVar3;
  double *local_e8;
  double *local_e0;
  double *local_d8;
  auto_ptr<const_viennamath::rt_expression_interface<double>_> local_d0;
  auto_ptr<const_viennamath::rt_expression_interface<double>_> local_c8;
  rt_expr<viennamath::rt_expression_interface<double>_> local_c0;
  auto_ptr<const_viennamath::rt_expression_interface<double>_> local_b8;
  auto_ptr<const_viennamath::rt_expression_interface<double>_> local_b0;
  rt_expr<viennamath::rt_expression_interface<double>_> local_a8;
  ct_vector_3<viennamath::rt_constant<double,_viennamath::rt_expression_interface<double>_>,_viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>,_viennamath::ct_constant<8L>_>
  local_a0;
  ct_vector_3<viennamath::rt_constant<double,_viennamath::rt_expression_interface<double>_>,_viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>,_viennamath::ct_constant<8L>_>
  local_78;
  ct_vector_3<viennamath::rt_constant<double,_viennamath::rt_expression_interface<double>_>,_viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>,_viennamath::ct_constant<8L>_>
  local_50;
  
  local_e8 = (double *)operator_new(0x18);
  local_e0 = local_e8 + 3;
  *local_e8 = 4.0;
  local_e8[1] = 6.0;
  local_e8[2] = 8.0;
  local_d8 = local_e0;
  poVar2 = viennamath::operator<<((ostream *)&std::cout,e);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," at STL (",9);
  poVar2 = std::ostream::_M_insert<double>(*local_e8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = std::ostream::_M_insert<double>(local_e8[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = std::ostream::_M_insert<double>(local_e8[2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," = ",3);
  prVar1 = (e->rt_expr_)._M_ptr;
  (*prVar1->_vptr_rt_expression_interface[5])(prVar1,&local_e8);
  poVar2 = std::ostream::_M_insert<double>(extraout_XMM0_Qa);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," = ",3);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr(&local_a8,e);
  (*(*(_func_int ***)local_a8.rt_expr_._M_ptr)[5])(local_a8.rt_expr_._M_ptr,&local_e8);
  poVar2 = std::ostream::_M_insert<double>(extraout_XMM0_Qa_00);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," (reference solution: ",0x16);
  poVar2 = std::ostream::_M_insert<double>(ref_solution);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (local_a8.rt_expr_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(*(_func_int ***)local_a8.rt_expr_._M_ptr)[1])();
  }
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_b0,e);
  (*(local_b0._M_ptr)->_vptr_rt_expression_interface[5])(local_b0._M_ptr,&local_e8);
  if (extraout_XMM0_Qa_01 <= ref_solution) {
    viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr
              ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_b8,e);
    (*(local_b8._M_ptr)->_vptr_rt_expression_interface[5])(local_b8._M_ptr,&local_e8);
    if (ref_solution <= extraout_XMM0_Qa_02) {
      if (local_b8._M_ptr != (rt_expression_interface<double> *)0x0) {
        (*(local_b8._M_ptr)->_vptr_rt_expression_interface[1])();
      }
      if (local_b0._M_ptr != (rt_expression_interface<double> *)0x0) {
        (*(local_b0._M_ptr)->_vptr_rt_expression_interface[1])();
      }
      poVar2 = viennamath::operator<<((ostream *)&std::cout,e);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," at vector_3 (",0xe);
      local_78.t0_.super_rt_expression_interface<double>._vptr_rt_expression_interface =
           (_func_int **)&PTR__rt_expression_interface_0012f3a0;
      local_78.t0_.s = 4.0;
      local_78.t1_.super_rt_expression_interface<double>._vptr_rt_expression_interface =
           (_func_int **)&PTR__rt_expression_interface_0012f460;
      local_78.t1_.s = 6;
      poVar2 = viennamath::operator<<(poVar2,&local_78);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," = ",3);
      local_a0.t0_.super_rt_expression_interface<double>._vptr_rt_expression_interface =
           (_func_int **)&PTR__rt_expression_interface_0012f3a0;
      local_a0.t0_.s = 4.0;
      local_a0.t1_.super_rt_expression_interface<double>._vptr_rt_expression_interface =
           (_func_int **)&PTR__rt_expression_interface_0012f460;
      local_a0.t1_.s = 6;
      nVar3 = viennamath::rt_expr<viennamath::rt_expression_interface<double>>::operator()
                        ((rt_expr<viennamath::rt_expression_interface<double>> *)e,&local_a0);
      poVar2 = std::ostream::_M_insert<double>(nVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," = ",3);
      viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr(&local_c0,e);
      local_50.t0_.super_rt_expression_interface<double>._vptr_rt_expression_interface =
           (_func_int **)&PTR__rt_expression_interface_0012f3a0;
      local_50.t0_.s = 4.0;
      local_50.t1_.super_rt_expression_interface<double>._vptr_rt_expression_interface =
           (_func_int **)&PTR__rt_expression_interface_0012f460;
      local_50.t1_.s = 6;
      nVar3 = viennamath::rt_expr<viennamath::rt_expression_interface<double>>::operator()
                        ((rt_expr<viennamath::rt_expression_interface<double>> *)&local_c0,&local_50
                        );
      poVar2 = std::ostream::_M_insert<double>(nVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," (reference solution: ",0x16);
      poVar2 = std::ostream::_M_insert<double>(ref_solution);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      if (local_c0.rt_expr_._M_ptr != (rt_expression_interface<double> *)0x0) {
        (*(*(_func_int ***)local_c0.rt_expr_._M_ptr)[1])();
      }
      viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr
                ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_c8,e);
      local_78.t0_.super_rt_expression_interface<double>._vptr_rt_expression_interface =
           (_func_int **)&PTR__rt_expression_interface_0012f3a0;
      local_78.t0_.s = 4.0;
      local_78.t1_.super_rt_expression_interface<double>._vptr_rt_expression_interface =
           (_func_int **)&PTR__rt_expression_interface_0012f460;
      local_78.t1_.s = 6;
      nVar3 = viennamath::rt_expr<viennamath::rt_expression_interface<double>>::operator()
                        ((rt_expr<viennamath::rt_expression_interface<double>> *)&local_c8,&local_78
                        );
      if (nVar3 <= ref_solution) {
        viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr
                  ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_d0,e);
        local_a0.t0_.super_rt_expression_interface<double>._vptr_rt_expression_interface =
             (_func_int **)&PTR__rt_expression_interface_0012f3a0;
        local_a0.t0_.s = 4.0;
        local_a0.t1_.super_rt_expression_interface<double>._vptr_rt_expression_interface =
             (_func_int **)&PTR__rt_expression_interface_0012f460;
        local_a0.t1_.s = 6;
        nVar3 = viennamath::rt_expr<viennamath::rt_expression_interface<double>>::operator()
                          ((rt_expr<viennamath::rt_expression_interface<double>> *)&local_d0,
                           &local_a0);
        if (ref_solution <= nVar3) {
          if (local_d0._M_ptr != (rt_expression_interface<double> *)0x0) {
            (*(local_d0._M_ptr)->_vptr_rt_expression_interface[1])();
          }
          if (local_c8._M_ptr != (rt_expression_interface<double> *)0x0) {
            (*(local_c8._M_ptr)->_vptr_rt_expression_interface[1])();
          }
          if (local_e8 != (double *)0x0) {
            operator_delete(local_e8,(long)local_d8 - (long)local_e8);
          }
          return;
        }
      }
      __assert_fail("viennamath::eval(e, viennamath::make_vector(c4, c6, c8)) <= ref_solution && viennamath::eval(e, viennamath::make_vector(c4, c6, c8)) >= ref_solution"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/viennamath[P]viennamath-dev/tests/src/runtime_test.cpp"
                    ,0x4b,"void evaluations_test(E &, double) [E = viennamath::rt_expr<>]");
    }
  }
  __assert_fail("viennamath::eval(e, p) <= ref_solution && viennamath::eval(e, p) >= ref_solution",
                "/workspace/llm4binary/github/license_all_cmakelists_25/viennamath[P]viennamath-dev/tests/src/runtime_test.cpp"
                ,0x45,"void evaluations_test(E &, double) [E = viennamath::rt_expr<>]");
}

Assistant:

void evaluations_test(E & e, double ref_solution)
{
  viennamath::rt_constant<double> c4(4.0);
  viennamath::rt_constant<long> c6(6);
  viennamath::ct_constant<8> c8;

  std::vector<double> p(3);
  p[0] = 4;
  p[1] = 6;
  p[2] = 8;


  std::cout << e << " at STL (" << p[0] << ", " << p[1] << ", " << p[2] << ")"
            << " = " << e(p)
            << " = " << viennamath::eval(e,p)
            << " (reference solution: " << ref_solution << ")" << std::endl;
  assert(viennamath::eval(e, p) <= ref_solution && viennamath::eval(e, p) >= ref_solution);

  std::cout << e << " at vector_3 (" << viennamath::make_vector(c4, c6, c8) << ")"
            << " = " << e(viennamath::make_vector(c4, c6, c8))
            << " = " << viennamath::eval(e, viennamath::make_vector(c4, c6, c8))
            << " (reference solution: " << ref_solution << ")" << std::endl;
  assert(viennamath::eval(e, viennamath::make_vector(c4, c6, c8)) <= ref_solution && viennamath::eval(e, viennamath::make_vector(c4, c6, c8)) >= ref_solution);

}